

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O1

SockData * AGSSock::recvfrom_impl<AGSSock::SockData>(Socket *sock,SockAddr *addr)

{
  ssize_t sVar1;
  int *piVar2;
  string *this;
  socklen_t addrlen;
  char buffer [65536];
  socklen_t sStack_1003c;
  long *aplStack_10038 [2];
  long alStack_10028 [2];
  undefined1 auStack_10018 [65535];
  undefined1 local_19;
  
  local_19 = 0;
  sStack_1003c = 0x80;
  this = (string *)0x0;
  sVar1 = recvfrom(sock->id,auStack_10018,0xffff,0,(sockaddr *)addr,&sStack_1003c);
  piVar2 = __errno_location();
  sock->error = *piVar2;
  if (sVar1 != -1) {
    this = (string *)operator_new(0x20);
    *(string **)this = this + 0x10;
    *(undefined8 *)(this + 8) = 0;
    this[0x10] = (string)0x0;
    (**(code **)(*AGSSockAPI::engine + 0x220))(AGSSockAPI::engine,this,&agsSockData);
    aplStack_10038[0] = alStack_10028;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)aplStack_10038,auStack_10018,auStack_10018 + sVar1);
    std::__cxx11::string::operator=(this,(string *)aplStack_10038);
    if (aplStack_10038[0] != alStack_10028) {
      operator_delete(aplStack_10038[0],alStack_10028[0] + 1);
    }
  }
  return (SockData *)this;
}

Assistant:

inline T *recvfrom_impl(Socket *sock, SockAddr *addr)
{
	char buffer[65536];
	buffer[sizeof (buffer) - 1] = 0;

	ADDRLEN addrlen = sizeof (SockAddr);
	long ret = recvfrom(sock->id, buffer, sizeof (buffer) - 1, 0,
		ADDR(addr), &addrlen);
	sock->error = GET_ERROR();
	
	if (ret == SOCKET_ERROR)
		return nullptr;
	
	return recvfrom_return<T>(buffer, ret);
}